

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall Am_Object_Data::sever_copies(Am_Object_Data *this,Am_Slot_Data *proto)

{
  Am_Object_Data *local_20;
  Am_Object_Data *current;
  Am_Slot_Data *proto_local;
  Am_Object_Data *this_local;
  
  *(ushort *)&proto->field_0x38 =
       *(ushort *)&proto->field_0x38 & 0xff00 | *(ushort *)&proto->field_0x38 & 0xfe;
  for (local_20 = this->first_instance; local_20 != (Am_Object_Data *)0x0;
      local_20 = local_20->next_instance) {
    sever_slot(local_20,proto);
  }
  return;
}

Assistant:

void
Am_Object_Data::sever_copies(Am_Slot_Data *proto)
{
  proto->flags &= ~BIT_IS_INHERITED;
  Am_Object_Data *current = first_instance;
  while (current) {
    current->sever_slot(proto);
    current = current->next_instance;
  }
}